

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.h
# Opt level: O2

NLSolution * __thiscall
mp::NLSolver::Solve(NLSolution *__return_storage_ptr__,NLSolver *this,NLModel *mdl,string *solver,
                   string *solver_opts)

{
  double *x;
  bool bVar1;
  double dVar2;
  NLSolution NStack_b8;
  
  NLSolution::NLSolution(__return_storage_ptr__);
  bVar1 = LoadModel(this,mdl);
  if (bVar1) {
    bVar1 = Solve(this,solver,solver_opts);
    if (bVar1) {
      ReadSolution(&NStack_b8,this);
      NLSolution::operator=(__return_storage_ptr__,&NStack_b8);
      NLSolution::~NLSolution(&NStack_b8);
      x = (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != x) {
        dVar2 = NLModel::ComputeObjValue(mdl,x);
        __return_storage_ptr__->obj_val_ = dVar2;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NLSolution Solve(const NLModel& mdl,
                   const std::string& solver,
                   const std::string& solver_opts) {
    NLSolution sol;
    if (LoadModel(mdl)
        && Solve(solver, solver_opts)) {
      sol = ReadSolution();
      if (sol.x_.size())
        sol.obj_val_ = mdl.ComputeObjValue(sol.x_.data());
    }
    return sol;
  }